

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:306:36)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:306:36)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  anon_class_16_1_f1e7abc2 *this_00;
  gc_heap *h;
  gc_heap *num_bytes;
  long lVar1;
  gc_heap_ptr_untyped local_a0;
  gc_heap_ptr_untyped local_90;
  gc_heap_ptr_untyped local_80;
  undefined1 local_70 [24];
  anon_union_32_5_7b1e0779_for_value_3 local_58;
  pointer local_38;
  
  h = (this->f).prototype.super_gc_heap_ptr_untyped.heap_;
  this_00 = &(this->f).new_date;
  lVar1 = std::chrono::_V2::system_clock::now();
  local_38 = (pointer)floor(((double)lVar1 / 1000000000.0) * 1000.0);
  num_bytes = (this->f).new_date.prototype.super_gc_heap_ptr_untyped.heap_;
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  object::class_name((object *)local_70);
  gc_heap::
  allocate_and_construct<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::date_object>const&,double&>
            ((gc_heap *)&local_90,(size_t)num_bytes,(string *)0x28,
             (gc_heap_ptr<mjs::date_object> *)local_70,(double *)this_00);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_70);
  local_a0.heap_ = local_90.heap_;
  local_a0.pos_ = local_90.pos_;
  if (local_90.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_90.heap_,&local_a0);
  }
  local_70._16_4_ = 5;
  local_58.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_a0.heap_;
  local_58.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a0.pos_;
  if (local_a0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)&local_58.s_);
  }
  to_string((mjs *)&local_80,h,(value *)(local_70 + 0x10));
  __return_storage_ptr__->type_ = string;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_80.heap_;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_80.pos_;
  if ((slot *)local_80.heap_ != (slot *)0x0) {
    gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  value::destroy((value *)(local_70 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }